

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O3

uint8_t * __thiscall
cdns::dump_block_parameters_storage
          (cdns *this,uint8_t *in,uint8_t *in_max,char *out_buf,char *out_max,int *err,FILE *F_out)

{
  long lVar1;
  byte bVar2;
  int64_t iVar3;
  byte *in_00;
  uint8_t *in_01;
  int iVar4;
  bool bVar5;
  int64_t inner_val;
  char *p_out;
  int64_t local_60;
  int *local_58;
  uint local_50 [2];
  char *local_48;
  long local_40;
  char *local_38;
  
  bVar2 = *in;
  local_38 = out_max;
  in_00 = cbor_get_number(in,in_max,&local_60);
  if (bVar2 >> 5 == 5 && in_00 != (byte *)0x0) {
    fwrite("[\n",2,1,(FILE *)F_out);
    iVar3 = local_60;
    if (local_60 == -1) {
      local_60 = 0xffffffff;
    }
    if (in_00 < in_max && 0 < local_60) {
      local_40 = iVar3;
      iVar4 = 0;
      local_58 = err;
      do {
        bVar2 = *in_00;
        if (bVar2 == 0xff) {
          if (local_40 != -1) {
            fwrite("                    Error, end of array mark unexpected.\n",0x39,1,(FILE *)F_out
                  );
            *local_58 = -3;
            return (uint8_t *)0x0;
          }
          in_00 = in_00 + 1;
          goto LAB_0017fe18;
        }
        in_01 = cbor_get_number(in_00,in_max,(int64_t *)local_50);
        if (0x1f < bVar2) {
          fprintf((FILE *)F_out,"                    Unexpected type: %d(%d)\n",(ulong)(bVar2 >> 5),
                  (ulong)local_50[0]);
          *local_58 = -3;
          return (uint8_t *)0x0;
        }
        bVar5 = iVar4 != 0;
        iVar4 = iVar4 + -1;
        if (bVar5) {
          fwrite(",\n",2,1,(FILE *)F_out);
        }
        local_48 = out_buf;
        fprintf((FILE *)F_out,"                    %d,",(ulong)local_50[0]);
        in_00 = cbor_to_text(in_01,in_max,&local_48,local_38,local_58);
        fwrite(out_buf,1,(long)local_48 - (long)out_buf,(FILE *)F_out);
        lVar1 = local_60 + -1;
      } while (((in_00 < in_max) && (in_00 != (byte *)0x0)) &&
              (bVar5 = 1 < local_60, local_60 = lVar1, bVar5));
      local_60 = lVar1;
      if (in_00 == (byte *)0x0) {
        return (uint8_t *)0x0;
      }
    }
LAB_0017fe18:
    fwrite("\n                ]",0x12,1,(FILE *)F_out);
  }
  else {
    in_00 = (byte *)0x0;
    fprintf((FILE *)F_out,
            "       Error, cannot parse the first bytes of storage parameters (RFC), type %d.\n",
            (ulong)(bVar2 >> 5));
    *err = -3;
  }
  return in_00;
}

Assistant:

uint8_t* cdns::dump_block_parameters_storage(uint8_t* in, uint8_t* in_max, char* out_buf, char* out_max, int* err, FILE* F_out)
{
    char* p_out;
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in != NULL && outer_type == CBOR_T_MAP) {
        int rank = 0;
        fprintf(F_out, "[\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "                    Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                /* There should be two elements for each map item */
                int inner_type = CBOR_CLASS(*in);
                int64_t inner_val;

                in = cbor_get_number(in, in_max, &inner_val);
                if (inner_type != CBOR_T_UINT) {
                    fprintf(F_out, "                    Unexpected type: %d(%d)\n", inner_type, (int)inner_val);
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else {
                    if (rank != 0) {
                        fprintf(F_out, ",\n");
                    }
                    rank++;
                    {
                        /* Type definitions copies from RFC */
                        p_out = out_buf;
                        fprintf(F_out, "                    %d,", (int)inner_val);
                        in = cbor_to_text(in, in_max, &p_out, out_max, err);
                        fwrite(out_buf, 1, p_out - out_buf, F_out);
                    }
                    val--;
                }
            }
        }


        if (in != NULL) {
            fprintf(F_out, "\n                ]");
        }
    }
    else {
        fprintf(F_out, "       Error, cannot parse the first bytes of storage parameters (RFC), type %d.\n", outer_type);
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }

    return in;
}